

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O1

int metacall_initialize_ex(metacall_initialize_configuration_type *initialize_config)

{
  metacall_initialize_configuration_type *pmVar1;
  bool bVar2;
  int iVar3;
  loader_impl plVar4;
  long lVar5;
  size_t line;
  char *message;
  char *tag;
  
  iVar3 = metacall_initialize();
  if (iVar3 == 0) {
    lVar5 = 0;
    do {
      pmVar1 = initialize_config + lVar5;
      if ((initialize_config[lVar5].tag == (char *)0x0) && (pmVar1->options == (void *)0x0)) {
        return 0;
      }
      plVar4 = loader_get_impl(initialize_config[lVar5].tag);
      tag = pmVar1->tag;
      if (plVar4 == (loader_impl)0x0) {
        line = 0x166;
        message = "MetaCall failed to find \'%s_loader\'";
LAB_00124fb9:
        bVar2 = false;
        log_write_impl_va("metacall",line,"metacall_initialize_ex",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                          ,LOG_LEVEL_ERROR,message,tag);
      }
      else {
        loader_set_options(tag,pmVar1->options);
        iVar3 = loader_get_option_host(pmVar1->tag);
        if ((iVar3 != 0) && (iVar3 = loader_initialize_host(pmVar1->tag), iVar3 != 0)) {
          tag = pmVar1->tag;
          line = 0x171;
          message = "MetaCall failed to initialize \'%s_loader\' as host";
          goto LAB_00124fb9;
        }
        lVar5 = lVar5 + 1;
        bVar2 = true;
      }
    } while (bVar2);
  }
  return 1;
}

Assistant:

int metacall_initialize_ex(struct metacall_initialize_configuration_type initialize_config[])
{
	size_t index = 0;

	if (metacall_initialize() == 1)
	{
		return 1;
	}

	while (!(initialize_config[index].tag == NULL && initialize_config[index].options == NULL))
	{
		loader_impl impl = loader_get_impl(initialize_config[index].tag);

		if (impl == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall failed to find '%s_loader'", initialize_config[index].tag);
			return 1;
		}

		loader_set_options(initialize_config[index].tag, initialize_config[index].options);

		/* If we are initializing a loader as a host, we must initialize it */
		if (loader_get_option_host(initialize_config[index].tag))
		{
			if (loader_initialize_host(initialize_config[index].tag) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "MetaCall failed to initialize '%s_loader' as host", initialize_config[index].tag);
				return 1;
			}
		}

		++index;
	}

	return 0;
}